

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void output_requires(string *section,string *version,
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *s)

{
  bool bVar1;
  ostream *poVar2;
  reference pbVar3;
  char local_6a [2];
  char *local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_58 [8];
  string m2;
  _Self local_30;
  const_iterator i;
  bool first;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *s_local;
  string *version_local;
  string *section_local;
  
  i._M_node._7_1_ = 1;
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(s);
  while( true ) {
    m2.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(s);
    bVar1 = std::operator!=(&local_30,(_Self *)((long)&m2.field_2 + 8));
    if (!bVar1) break;
    if ((i._M_node._7_1_ & 1) == 0) {
      std::operator<<((ostream *)&std::cout,", ");
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)section);
      std::operator<<(poVar2,": ");
      i._M_node._7_1_ = 0;
    }
    pbVar3 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    std::__cxx11::string::string(local_58,(string *)pbVar3);
    local_60._M_current = (char *)std::__cxx11::string::begin();
    local_68 = (char *)std::__cxx11::string::end();
    local_6a[1] = 0x7e;
    local_6a[0] = '_';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_60,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_68,local_6a + 1,local_6a);
    poVar2 = std::operator<<((ostream *)&std::cout,"boost_");
    poVar2 = std::operator<<(poVar2,local_58);
    poVar2 = std::operator<<(poVar2," = ");
    std::operator<<(poVar2,(string *)version);
    std::__cxx11::string::~string(local_58);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

static void output_requires( std::string const & section, std::string const & version, std::set< std::string > const & s )
{
    bool first = true;

    for( std::set< std::string >::const_iterator i = s.begin(); i != s.end(); ++i )
    {
        if( first )
        {
            std::cout << section << ": ";
            first = false;
        }
        else
        {
            std::cout << ", ";
        }

        std::string m2( *i );
        std::replace( m2.begin(), m2.end(), '~', '_' );

        std::cout << "boost_" << m2 << " = " << version;
    }
}